

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O1

bool __thiscall Json::JsonArray::put(JsonArray *this,shared_ptr<Json::JsonValue> *jsonValue)

{
  element_type *peVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  long lVar5;
  
  peVar1 = (jsonValue->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    psVar4 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = psVar2;
    if ((long)psVar2 - (long)psVar4 != 0) {
      lVar5 = (long)psVar2 - (long)psVar4 >> 4;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      do {
        psVar3 = psVar4;
        if ((psVar4->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            peVar1) break;
        psVar4 = psVar4 + 1;
        lVar5 = lVar5 + -1;
        psVar3 = psVar2;
      } while (lVar5 != 0);
    }
    if (psVar3 == (this->__lstJsonArray).
                  super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      (*peVar1->_vptr_JsonValue[6])(peVar1,(ulong)(byte)(this->super_JsonFormatter).field_0x26);
      std::
      vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>::
      push_back(&this->__lstJsonArray,jsonValue);
      return true;
    }
  }
  return false;
}

Assistant:

bool Json::JsonArray::put(const std::shared_ptr<JsonValue> &jsonValue) {
    if (jsonValue == nullptr)return false;
    if (find(jsonValue.get()) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(jsonValue);
    return true;
}